

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O3

void __thiscall pg::NPPSolver::run(NPPSolver *this)

{
  bitset *pbVar1;
  uidlvector *this_00;
  list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
  *plVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  size_t sVar8;
  ulong *puVar9;
  bitset *pbVar10;
  _List_node_base *this_01;
  bool bVar11;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  _Map_pointer ppuVar12;
  uint *puVar13;
  _Node *p_Var14;
  Game *pGVar15;
  long lVar16;
  ostream *poVar17;
  uint uVar18;
  int iVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  uint *puVar24;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  ulong uVar19;
  
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->Phase,true);
  pbVar1 = &this->outgame;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pbVar1;
  std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
            ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Supgame,(bitset **)&local_88)
  ;
  this_02 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x50);
  (this_02->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_map_size = 0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(this_02,0);
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)this_02;
  std::
  vector<std::deque<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>*>>
  ::emplace_back<std::deque<unsigned_int,std::allocator<unsigned_int>>*>
            ((vector<std::deque<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>*>>
              *)&this->Heads,(deque<unsigned_int,_std::allocator<unsigned_int>_> **)&local_88);
  ppuVar12 = (_Map_pointer)operator_new(0x20);
  puVar13 = (uint *)((this->super_Solver).game)->n_vertices;
  ppuVar12[1] = puVar13;
  uVar23 = (long)puVar13 + 0x3f;
  puVar24 = (uint *)(uVar23 >> 6);
  ppuVar12[2] = puVar24;
  puVar24 = (uint *)((long)puVar24 << 3);
  ppuVar12[3] = puVar24;
  puVar13 = (uint *)operator_new__((ulong)puVar24);
  *ppuVar12 = puVar13;
  if (0x3f < uVar23) {
    memset(puVar13,0,(size_t)puVar24);
  }
  local_88._M_impl.super__Deque_impl_data._M_map = ppuVar12;
  std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
            ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Exits,(bitset **)&local_88);
  this_00 = &this->Entries;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)operator_new(0x18);
  local_88._M_impl.super__Deque_impl_data._M_map[1] =
       (uint *)local_88._M_impl.super__Deque_impl_data._M_map;
  *local_88._M_impl.super__Deque_impl_data._M_map =
       (uint *)local_88._M_impl.super__Deque_impl_data._M_map;
  local_88._M_impl.super__Deque_impl_data._M_map[2] = (uint *)0x0;
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*,std::allocator<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>>
  ::
  emplace_back<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>
            ((vector<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*,std::allocator<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>>
              *)this_00,
             (list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              **)&local_88);
  plVar2 = (list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
            *)*(this->Entries).
               super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_88,0);
  p_Var14 = std::__cxx11::
            list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
            ::_M_create_node<std::deque<unsigned_int,std::allocator<unsigned_int>>>
                      (plVar2,(deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
  plVar2 = plVar2 + 0x10;
  *(long *)plVar2 = *(long *)plVar2 + 1;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
  pGVar15 = (this->super_Solver).game;
  puVar3 = ((this->super_Solver).disabled)->_bits;
  uVar18 = (int)pGVar15->n_vertices - 1;
  uVar19 = (ulong)uVar18;
  uVar23 = (ulong)(int)uVar18;
  uVar21 = uVar23 >> 6;
  if ((puVar3[uVar21] >> (uVar19 & 0x3f) & 1) != 0) {
    puVar4 = pbVar1->_bits;
    uVar23 = uVar19;
    do {
      uVar18 = (int)uVar19 - 1;
      uVar19 = (ulong)uVar18;
      puVar4[uVar21] = puVar4[uVar21] | 1L << (uVar23 & 0x3f);
      uVar23 = (ulong)(int)uVar18;
      uVar21 = uVar23 >> 6;
    } while ((puVar3[uVar21] >> (uVar23 & 0x3f) & 1) != 0);
  }
  this->pos = uVar18;
  piVar5 = pGVar15->_priority;
  uVar18 = 0;
  this->maxprio = piVar5[uVar23];
  piVar6 = this->inverse;
  do {
    piVar6[uVar18] = -1;
    uVar18 = uVar18 + 1;
  } while (uVar18 <= this->maxprio);
  iVar20 = this->pos;
  if (-1 < iVar20) {
    puVar4 = (this->outgame)._bits;
    piVar6 = this->strategy;
    piVar7 = this->inverse;
    uVar23 = 0;
    do {
      if ((puVar3[uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
        piVar7[piVar5[uVar23]] = (int)uVar23;
        piVar6[uVar23] = -1;
        iVar20 = this->pos;
      }
      else {
        puVar9 = puVar4 + (uVar23 >> 6);
        *puVar9 = *puVar9 | 1L << (uVar23 & 0x3f);
      }
      bVar11 = (long)uVar23 < (long)iVar20;
      uVar23 = uVar23 + 1;
    } while (bVar11);
    if (-1 < iVar20) {
      do {
        this->doms = this->doms + 1;
        this->p = this->maxprio;
        this->alpha = this->maxprio & 1;
        (*(this->super_Solver)._vptr_Solver[7])(this);
        sVar8 = (this->outgame)._bitssize;
        if (sVar8 != 0) {
          puVar3 = (this->outgame)._bits;
          puVar4 = (this->R)._bits;
          sVar22 = 0;
          do {
            puVar9 = puVar3 + sVar22;
            *puVar9 = *puVar9 | puVar4[sVar22];
            sVar22 = sVar22 + 1;
          } while (sVar8 != sVar22);
        }
        if ((this->alpha == 0) && (sVar8 = (this->winzero)._bitssize, sVar8 != 0)) {
          puVar3 = (this->winzero)._bits;
          puVar4 = (this->R)._bits;
          sVar22 = 0;
          do {
            puVar9 = puVar3 + sVar22;
            *puVar9 = *puVar9 | puVar4[sVar22];
            sVar22 = sVar22 + 1;
          } while (sVar8 != sVar22);
        }
        uVar18 = this->inverse[this->maxprio];
        if (-1 < (int)uVar18) {
          do {
            if ((pbVar1->_bits[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) & 1) == 0) {
              this->pos = uVar18;
              this->maxprio = ((this->super_Solver).game)->_priority[uVar18];
              goto LAB_00150232;
            }
            bVar11 = 0 < (int)uVar18;
            uVar18 = uVar18 - 1;
          } while (bVar11);
          uVar18 = 0xffffffff;
        }
        this->pos = uVar18;
LAB_00150232:
        this->Pivot = 0;
        this->Top = 0;
        puVar9 = (this->Phase).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        *puVar9 = *puVar9 | 1;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  (*(this->Heads).
                    super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        pbVar10 = *(this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        sVar8 = pbVar10->_bitssize;
        if (sVar8 != 0) {
          memset(pbVar10->_bits,0,sVar8 << 3);
        }
        this_01 = (_List_node_base *)
                  *(this_00->
                   super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::
        _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::_M_clear((_List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)this_01);
        this_01->_M_prev = this_01;
        this_01->_M_next = this_01;
        this_01[1]._M_next = (_List_node_base *)0x0;
        plVar2 = (list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
                  *)*(this_00->
                     super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                  (&local_88,0);
        p_Var14 = std::__cxx11::
                  list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
                  ::_M_create_node<std::deque<unsigned_int,std::allocator<unsigned_int>>>
                            (plVar2,(deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88)
        ;
        std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
        plVar2 = plVar2 + 0x10;
        *(long *)plVar2 = *(long *)plVar2 + 1;
        std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
        sVar8 = (this->R)._bitssize;
        if (sVar8 != 0) {
          memset((this->R)._bits,0,sVar8 << 3);
        }
      } while (-1 < this->pos);
      pGVar15 = (this->super_Solver).game;
    }
  }
  this->pos = 0;
  lVar16 = pGVar15->n_vertices;
  if (0 < lVar16) {
    uVar23 = 0;
    iVar20 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
        Oink::solve((this->super_Solver).oink,iVar20,
                    (uint)(((this->winzero)._bits[uVar23 >> 6] & 1L << (uVar23 & 0x3f)) == 0),
                    this->strategy[uVar23]);
        iVar20 = this->pos;
        lVar16 = ((this->super_Solver).game)->n_vertices;
      }
      iVar20 = iVar20 + 1;
      uVar23 = (ulong)iVar20;
      this->pos = iVar20;
    } while ((long)uVar23 < lVar16);
  }
  poVar17 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"solved with ",0xc);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," total queries and ",0x13);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," total promotions;",0x12);
  std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  poVar17 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"            ",0xc);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," max queries and ",0x11);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," max promotions;",0x10);
  std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  poVar17 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"            ",0xc);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," dominions.",0xb);
  std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  return;
}

Assistant:

void NPPSolver::run()
{

    /* vv Stack initialization vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    Phase.push_back(true);
    Supgame.push_back(&outgame);
    Heads.push_back(new uideque());
    Exits.push_back(new bitset(nodecount()));
    Entries.push_back(new uidlist());
    Entries[0]->push_front(uideque());
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = nodecount() - 1;; --pos)
    {
        if (disabled[pos])
        {
            outgame[pos] = true;
        }
        else
        {
            maxprio = priority(pos);
            break;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of inverse, outgame, and strategy vvvvvvvvvvvvvvvvvvvv */
    for (uint prt = 0; prt <= maxprio; ++prt)
    {
        inverse[prt] = -1;
    }
    for (int sop = 0; sop <= pos; sop++)
    {
        if (disabled[sop])
        {
            outgame[sop] = true;
        }
        else
        {
            inverse[priority(sop)] = sop;
            strategy[sop] = -1;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Main solution cycle vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    while (pos >= 0)
    {

        /* vv Update of the statistic on the number of dominions vvvvvvvvvvvvvvvv */
        doms++;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Setting of the initial priority and parity vvvvvvvvvvvvvvvvvvvvvvvv */
        p = maxprio;
        alpha = p & 1;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Call to the search routine and update of the zero winning region vv */
        search();
        outgame |= R;
        if (alpha == 0)
        {
            winzero |= R;
        }
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Search for the new pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        for (pos = inverse[maxprio]; pos >= 0 && outgame[pos]; --pos)
        {
        }
        if (pos >= 0) maxprio = priority(pos);
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Stack and current region cleaning vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        Top = Pivot = 0;
        Phase[0] = true;
        Heads[0]->clear();
        Exits[0]->reset();
        Entries[0]->clear();
        Entries[0]->push_front(uideque());
        R.reset();
        // /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Setting of the final solution vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = 0; pos < nodecount(); ++pos)
    {
        if (disabled[pos]) continue;
        Solver::solve(pos, !winzero[pos], strategy[pos]);
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Printing of statistics vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    logger << "solved with " << totqueries << " total queries and " << totpromos << " total promotions;" << std::endl;
    logger << "            " << maxqueries << " max queries and " << maxpromos << " max promotions;" << std::endl;
    logger << "            " << doms << " dominions." << std::endl;
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */
}